

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.H
# Opt level: O1

void __thiscall amrex::FabArrayBase::CacheStats::print(CacheStats *this)

{
  ostringstream *this_00;
  Print local_198;
  
  local_198.os = OutStream();
  this_00 = &local_198.ss;
  local_198.rank = -1;
  local_198.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"### ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ###\n",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"    tot # of builds  : ",0x17);
  std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"    tot # of erasures: ",0x17);
  std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"    tot # of uses    : ",0x17);
  std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"    max cache size   : ",0x17);
  std::ostream::operator<<(this_00,this->maxsize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"    max # of uses    : ",0x17);
  std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  Print::~Print(&local_198);
  return;
}

Assistant:

void print () {
            amrex::Print(Print::AllProcs) << "### " << name << " ###\n"
                                          << "    tot # of builds  : " << nbuild  << "\n"
                                          << "    tot # of erasures: " << nerase  << "\n"
                                          << "    tot # of uses    : " << nuse    << "\n"
                                          << "    max cache size   : " << maxsize << "\n"
                                          << "    max # of uses    : " << maxuse  << "\n";
        }